

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int ptrmapGet(BtShared *pBt,Pgno key,u8 *pEType,Pgno *pPgno)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  DbPage *pDbPage;
  DbPage *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
  uVar4 = 0;
  if (1 < key) {
    iVar2 = (key - 2) - (key - 2) % (pBt->usableSize / 5 + 1);
    uVar4 = iVar2 + (uint)(iVar2 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
  }
  iVar2 = (*pBt->pPager->xGet)(pBt->pPager,uVar4,&local_38,0);
  if (iVar2 == 0) {
    uVar4 = (~uVar4 + key) * 5;
    if ((int)uVar4 < 0) {
      uVar3 = 0x118ef;
      if (local_38 != (DbPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_38);
      }
    }
    else {
      pvVar1 = local_38->pData;
      *pEType = *(u8 *)((long)pvVar1 + (ulong)uVar4);
      if (pPgno != (Pgno *)0x0) {
        uVar4 = *(uint *)((long)pvVar1 + (ulong)uVar4 + 1);
        *pPgno = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
      if (local_38 != (DbPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_38);
      }
      iVar2 = 0;
      uVar3 = 0x118f7;
      if (0xfa < (byte)(*pEType - 6)) goto LAB_00140e2c;
    }
    iVar2 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar3,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
LAB_00140e2c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int ptrmapGet(BtShared *pBt, Pgno key, u8 *pEType, Pgno *pPgno){
  DbPage *pDbPage;   /* The pointer map page */
  int iPtrmap;       /* Pointer map page index */
  u8 *pPtrmap;       /* Pointer map page data */
  int offset;        /* Offset of entry in pointer map */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );

  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage, 0);
  if( rc!=0 ){
    return rc;
  }
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    sqlite3PagerUnref(pDbPage);
    return SQLITE_CORRUPT_BKPT;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  assert( pEType!=0 );
  *pEType = pPtrmap[offset];
  if( pPgno ) *pPgno = get4byte(&pPtrmap[offset+1]);

  sqlite3PagerUnref(pDbPage);
  if( *pEType<1 || *pEType>5 ) return SQLITE_CORRUPT_PGNO(iPtrmap);
  return SQLITE_OK;
}